

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cClipDistance.cpp
# Opt level: O0

bool __thiscall
gl3cts::ClipDistance::CoverageTest::MaxClipDistancesValueInFragmentShaderTest
          (CoverageTest *this,Functions *gl)

{
  GLchar *pGVar1;
  undefined8 gl_00;
  bool bVar2;
  TestLog *pTVar3;
  MessageBuilder *pMVar4;
  LinkageStatus *pLVar5;
  CompilationStatus *pCVar6;
  size_type sVar7;
  reference pvVar8;
  socklen_t __len;
  sockaddr *__addr;
  int __fd;
  MessageBuilder local_768;
  uint local_5e4;
  undefined1 local_5e0 [4];
  GLuint gl_max_clip_distances_value_in_fragment_shader;
  undefined1 local_460 [8];
  vector<float,_std::allocator<float>_> pixels;
  VertexArrayObject vertex_array_object;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  undefined1 local_2a0 [8];
  Program program;
  undefined1 local_218 [8];
  string fragment_shader;
  undefined1 local_1f0 [8];
  string vertex_shader;
  MessageBuilder local_1c8;
  undefined1 local_38 [8];
  Framebuffer framebuffer;
  Functions *gl_local;
  CoverageTest *this_local;
  
  __len = 1;
  framebuffer._16_8_ = gl;
  Utility::Framebuffer::Framebuffer((Framebuffer *)local_38,gl,1,1);
  __fd = (int)gl;
  bVar2 = Utility::Framebuffer::isValid((Framebuffer *)local_38);
  if (bVar2) {
    Utility::Framebuffer::bind((Framebuffer *)local_38,__fd,__addr,__len);
    Utility::Framebuffer::clear((Framebuffer *)local_38);
    pGVar1 = m_vertex_shader_code_case_1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_1f0,pGVar1,
               (allocator<char> *)(fragment_shader.field_2._M_local_buf + 0xf));
    std::allocator<char>::~allocator
              ((allocator<char> *)(fragment_shader.field_2._M_local_buf + 0xf));
    pGVar1 = m_fragment_shader_code_case_1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_218,pGVar1,(allocator<char> *)((long)&program.m_gl + 7));
    std::allocator<char>::~allocator((allocator<char> *)((long)&program.m_gl + 7));
    gl_00 = framebuffer._16_8_;
    local_2b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_2b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_2b8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_2b8);
    Utility::Program::Program
              ((Program *)local_2a0,(Functions *)gl_00,(string *)local_1f0,(string *)local_218,
               &local_2b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_2b8);
    pLVar5 = Utility::Program::ProgramStatus((Program *)local_2a0);
    if (pLVar5->program_id == 0) {
      pTVar3 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&vertex_array_object.m_vertex_array_object_id,pTVar3,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      pMVar4 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&vertex_array_object.m_vertex_array_object_id,
                          (char (*) [42])"Program failed to build.\n Vertex Shader:\n");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&m_vertex_shader_code_case_1);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [33])"\nVertex Shader compilation log:\n");
      pCVar6 = Utility::Program::VertexShaderStatus((Program *)local_2a0);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&pCVar6->shader_log);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [24])"\nWith Fragment Shader:\n");
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&m_fragment_shader_code_case_1);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [40])"\nWith Fragment Shader compilation log:\n");
      pCVar6 = Utility::Program::FragmentShaderStatus((Program *)local_2a0);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&pCVar6->shader_log);
      pMVar4 = tcu::MessageBuilder::operator<<
                         (pMVar4,(char (*) [28])"\nWith Program linkage log:\n");
      pCVar6 = Utility::Program::FragmentShaderStatus((Program *)local_2a0);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&pCVar6->shader_log);
      pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [2])0x2b8f97b);
      tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder
                ((MessageBuilder *)&vertex_array_object.m_vertex_array_object_id);
      this_local._7_1_ = false;
      vertex_shader.field_2._12_4_ = 1;
    }
    else {
      Utility::Program::UseProgram((Program *)local_2a0);
      Utility::VertexArrayObject::VertexArrayObject
                ((VertexArrayObject *)
                 &pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,(Functions *)framebuffer._16_8_,0);
      Utility::VertexArrayObject::draw
                ((VertexArrayObject *)
                 &pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage,0,1);
      Utility::Framebuffer::readPixels
                ((vector<float,_std::allocator<float>_> *)local_460,(Framebuffer *)local_38);
      sVar7 = std::vector<float,_std::allocator<float>_>::size
                        ((vector<float,_std::allocator<float>_> *)local_460);
      if (sVar7 == 0) {
        pTVar3 = tcu::TestContext::getLog
                           ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)local_5e0,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar4 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)local_5e0,(char (*) [19])"ReadPixels error.\n");
        tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)local_5e0);
        this_local._7_1_ = false;
      }
      else {
        pvVar8 = std::vector<float,_std::allocator<float>_>::front
                           ((vector<float,_std::allocator<float>_> *)local_460);
        local_5e4 = (uint)(long)*pvVar8;
        if (local_5e4 == this->m_gl_max_clip_distances_value) {
          this_local._7_1_ = true;
        }
        else {
          pTVar3 = tcu::TestContext::getLog
                             ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_768,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (&local_768,
                              (char (*) [76])
                              "Fragment shader\'s gl_MaxClipDistances constant has improper value equal to "
                             );
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&local_5e4);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [5])0x2a6afb1);
          pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_gl_max_clip_distances_value);
          pMVar4 = tcu::MessageBuilder::operator<<
                             (pMVar4,(char (*) [26])"is expected. Test failed.");
          tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_768);
          this_local._7_1_ = false;
        }
      }
      vertex_shader.field_2._12_4_ = 1;
      std::vector<float,_std::allocator<float>_>::~vector
                ((vector<float,_std::allocator<float>_> *)local_460);
      Utility::VertexArrayObject::~VertexArrayObject
                ((VertexArrayObject *)
                 &pixels.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
    }
    Utility::Program::~Program((Program *)local_2a0);
    std::__cxx11::string::~string((string *)local_218);
    std::__cxx11::string::~string((string *)local_1f0);
  }
  else {
    pTVar3 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_1c8,pTVar3,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar4 = tcu::MessageBuilder::operator<<
                       (&local_1c8,(char (*) [47])"Unable to create framebuffer with size [1,1].\n")
    ;
    tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1c8);
    this_local._7_1_ = false;
    vertex_shader.field_2._12_4_ = 1;
  }
  Utility::Framebuffer::~Framebuffer((Framebuffer *)local_38);
  return this_local._7_1_;
}

Assistant:

bool gl3cts::ClipDistance::CoverageTest::MaxClipDistancesValueInFragmentShaderTest(const glw::Functions& gl)
{
	/*  Make a program that consist of vertex and fragment shader stages. In
	 vertex shader setup gl_Position with passed in attribute. Check in
	 fragment shader using "if" statement that gl_MaxClipDistances is equal
	 to GL_MAX_CLIP_DISTANCES passed by uniform. If compared values are not
	 equal, discard the fragment. Output distinguishable color otherwise.
	 Check that the shader program compiles and links successfully. Draw a
	 single GL_POINT with screen centered position attribute and with a
	 configured 1 x 1 pixel size framebuffer. Using glReadPixels function,
	 check that point's fragments were not discarded. */

	/* Creating red-color-only frambuffer. */
	gl3cts::ClipDistance::Utility::Framebuffer framebuffer(gl, 1, 1);

	if (!framebuffer.isValid())
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Unable to create framebuffer with size [1,1].\n"
						   << tcu::TestLog::EndMessage;
		return false;
	}

	framebuffer.bind();
	framebuffer.clear();

	/* Building program. */
	const std::string vertex_shader   = m_vertex_shader_code_case_1;
	const std::string fragment_shader = m_fragment_shader_code_case_1;

	gl3cts::ClipDistance::Utility::Program program(gl, vertex_shader, fragment_shader);

	if (program.ProgramStatus().program_id == 0)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Program failed to build.\n Vertex Shader:\n"
						   << m_vertex_shader_code_case_1 << "\nVertex Shader compilation log:\n"
						   << program.VertexShaderStatus().shader_log << "\nWith Fragment Shader:\n"
						   << m_fragment_shader_code_case_1 << "\nWith Fragment Shader compilation log:\n"
						   << program.FragmentShaderStatus().shader_log << "\nWith Program linkage log:\n"
						   << program.FragmentShaderStatus().shader_log << "\n"
						   << tcu::TestLog::EndMessage;
		return false;
	}

	program.UseProgram();

	/* Creating empty VAO. */
	gl3cts::ClipDistance::Utility::VertexArrayObject vertex_array_object(gl, GL_POINTS);

	/* Draw test. */
	vertex_array_object.draw(0, 1);

	/* Fetch results. */
	std::vector<glw::GLfloat> pixels = framebuffer.readPixels();

	if (pixels.size() < 1)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "ReadPixels error.\n" << tcu::TestLog::EndMessage;
		return false;
	}

	/* Check results. */
	glw::GLuint gl_max_clip_distances_value_in_fragment_shader = glw::GLuint(pixels.front());

	if (gl_max_clip_distances_value_in_fragment_shader != glw::GLuint(m_gl_max_clip_distances_value))
	{
		m_testCtx.getLog() << tcu::TestLog::Message
						   << "Fragment shader's gl_MaxClipDistances constant has improper value equal to "
						   << gl_max_clip_distances_value_in_fragment_shader << "but " << m_gl_max_clip_distances_value
						   << "is expected. Test failed." << tcu::TestLog::EndMessage;
		return false;
	}

	/* Test passed. */
	return true;
}